

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O1

t_object * __thiscall
xemmai::t_heap<xemmai::t_object>::f_find(t_heap<xemmai::t_object> *this,void *a_p)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  
  p_Var1 = &(this->v_blocks)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->v_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var2 != (_Rb_tree_node_base *)0x0;
      p_Var2 = (&p_Var2->_M_left)[*(void **)(p_Var2 + 1) < a_p]) {
    if (*(void **)(p_Var2 + 1) >= a_p) {
      p_Var3 = p_Var2;
    }
  }
  if (((_Rb_tree_header *)p_Var3 == p_Var1) || (*(void **)(p_Var3 + 1) != a_p)) {
    if (p_Var3 == (this->v_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      return (t_object *)0x0;
    }
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var3);
  }
  p_Var4 = (_Base_ptr)((long)a_p - *(long *)(p_Var3 + 1));
  if (p_Var3[1]._M_parent <= p_Var4) {
    return (t_object *)0x0;
  }
  if (((0x80L << (*(byte *)(*(long *)(p_Var3 + 1) + 0x30) & 0x3f)) - 1U & (ulong)p_Var4) == 0) {
    return (t_object *)a_p;
  }
  return (t_object *)0x0;
}

Assistant:

T* f_find(void* a_p)
	{
		auto i = v_blocks.lower_bound(static_cast<T*>(a_p));
		if (i == v_blocks.end() || i->first != a_p) {
			if (i == v_blocks.begin()) return nullptr;
			--i;
		}
		size_t j = static_cast<char*>(a_p) - reinterpret_cast<char*>(i->first);
		return j < i->second && (j & (c_UNIT << i->first->v_rank) - 1) == 0 ? static_cast<T*>(a_p) : nullptr;
	}